

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O1

bool __thiscall TCMalloc_PageMap2<35>::Ensure(TCMalloc_PageMap2<35> *this,Number start,size_t n)

{
  bool bVar1;
  Leaf *__s;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (start + n) - 1;
  do {
    uVar2 = start;
    if (uVar3 < uVar2) break;
    start = uVar2;
    if (uVar2 < 0x800000000) {
      if (this->root_[uVar2 >> 0x12] == (Leaf *)0x0) {
        __s = (Leaf *)(*this->allocator_)(0x200000);
        if (__s == (Leaf *)0x0) {
          bVar1 = false;
          goto LAB_0011a26f;
        }
        memset(__s,0,0x200000);
        this->root_[uVar2 >> 0x12] = __s;
      }
      bVar1 = true;
      start = (uVar2 & 0x7fffc0000) + 0x40000;
    }
    else {
      bVar1 = false;
    }
LAB_0011a26f:
  } while (bVar1);
  return uVar3 < uVar2;
}

Assistant:

bool Ensure(Number start, size_t n) {
    for (Number key = start; key <= start + n - 1; ) {
      const Number i1 = key >> LEAF_BITS;

      // Check for overflow
      if (i1 >= ROOT_LENGTH)
        return false;

      // Make 2nd level node if necessary
      if (root_[i1] == nullptr) {
        Leaf* leaf = reinterpret_cast<Leaf*>((*allocator_)(sizeof(Leaf)));
        if (leaf == nullptr) return false;
        memset(leaf, 0, sizeof(*leaf));
        root_[i1] = leaf;
      }

      // Advance key past whatever is covered by this leaf node
      key = ((key >> LEAF_BITS) + 1) << LEAF_BITS;
    }
    return true;
  }